

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  cmMessenger *__s;
  bool bVar1;
  bool local_111;
  cmListFileBacktrace local_110;
  undefined1 local_100 [8];
  cmListFileParser parser;
  bool parseError;
  allocator<char> local_51;
  string local_50;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *lfbt_local;
  cmMessenger *messenger_local;
  char *filename_local;
  cmListFile *this_local;
  
  local_30 = lfbt;
  lfbt_local = (cmListFileBacktrace *)messenger;
  messenger_local = (cmMessenger *)filename;
  filename_local = (char *)this;
  bVar1 = cmsys::SystemTools::FileExists(filename);
  __s = messenger_local;
  parser.Separation._3_1_ = SeparationOkay >> 0x18;
  local_111 = true;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,&__s->SuppressDevWarnings,&local_51);
    parser.Separation._3_1_ = 1;
    local_111 = cmsys::SystemTools::FileIsDirectory(&local_50);
  }
  if ((parser.Separation._3_1_ & 1) != SeparationOkay >> 0x18) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_51);
  }
  if (local_111 == false) {
    parser.Separation._2_1_ = SeparationOkay >> 0x10;
    cmListFileBacktrace::cmListFileBacktrace(&local_110,local_30);
    cmListFileParser::cmListFileParser
              ((cmListFileParser *)local_100,this,&local_110,(cmMessenger *)lfbt_local,
               &messenger_local->SuppressDevWarnings);
    cmListFileBacktrace::~cmListFileBacktrace(&local_110);
    bVar1 = cmListFileParser::ParseFile((cmListFileParser *)local_100);
    parser.Separation._2_1_ = (bVar1 ^ 0xff) & 1;
    cmListFileParser::~cmListFileParser((cmListFileParser *)local_100);
    this_local._7_1_ = (bool)((parser.Separation._2_1_ ^ 0xff) & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}